

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O0

int znzprintf(znzFile stream,char *format,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  uint local_4c;
  undefined4 local_48;
  int size;
  va_list va;
  char *tmpstr;
  int retval;
  char *format_local;
  znzFile stream_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  if (stream == (znzFile)0x0) {
    stream_local._4_4_ = 0;
  }
  else {
    va[0].overflow_arg_area = local_108;
    va[0]._0_8_ = &stack0x00000008;
    size = 0x30;
    local_48 = 0x10;
    local_f8 = in_RDX;
    local_f0 = in_RCX;
    local_e8 = in_R8;
    local_e0 = in_R9;
    if (stream->zfptr == (gzFile)0x0) {
      tmpstr._4_4_ = vfprintf((FILE *)stream->nzfptr,format,&local_48);
    }
    else {
      sVar1 = strlen(format);
      local_4c = (int)sVar1 + 1000000;
      va[0].reg_save_area = calloc(1,(long)(int)local_4c);
      if ((char *)va[0].reg_save_area == (char *)0x0) {
        fprintf(_stderr,"** ERROR: znzprintf failed to alloc %d bytes\n",(ulong)local_4c);
        return 0;
      }
      vsprintf((char *)va[0].reg_save_area,format,&local_48);
      tmpstr._4_4_ = gzprintf(stream->zfptr,"%s",va[0].reg_save_area);
      free(va[0].reg_save_area);
    }
    stream_local._4_4_ = tmpstr._4_4_;
  }
  return stream_local._4_4_;
}

Assistant:

int znzprintf(znzFile stream, const char *format, ...)
{
  int retval=0;
  char *tmpstr;
  va_list va;
  if (stream==NULL) { return 0; }
  va_start(va, format);
#ifdef HAVE_ZLIB
  if (stream->zfptr!=NULL) {
    int size;  /* local to HAVE_ZLIB block */
    size = strlen(format) + 1000000;  /* overkill I hope */
    tmpstr = (char *)calloc(1, size);
    if( tmpstr == NULL ){
       fprintf(stderr,"** ERROR: znzprintf failed to alloc %d bytes\n", size);
       return retval;
    }
    vsprintf(tmpstr,format,va);
    retval=gzprintf(stream->zfptr,"%s",tmpstr);
    free(tmpstr);
  } else
#endif
  {
   retval=vfprintf(stream->nzfptr,format,va);
  }
  va_end(va);
  return retval;
}